

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::LogToTTY(int max_depth)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiWindow *window;
  ImGuiContext *g;
  int max_depth_local;
  
  pIVar2 = GImGui;
  if ((GImGui->LogEnabled & 1U) == 0) {
    pIVar1 = GImGui->CurrentWindow;
    GImGui->LogFile = _stdout;
    pIVar2->LogEnabled = true;
    pIVar2->LogStartDepth = (pIVar1->DC).TreeDepth;
    if (-1 < max_depth) {
      pIVar2->LogAutoExpandMaxDepth = max_depth;
    }
  }
  return;
}

Assistant:

void ImGui::LogToTTY(int max_depth)
{
    ImGuiContext& g = *GImGui;
    if (g.LogEnabled)
        return;
    ImGuiWindow* window = g.CurrentWindow;

    IM_ASSERT(g.LogFile == NULL);
    g.LogFile = stdout;
    g.LogEnabled = true;
    g.LogStartDepth = window->DC.TreeDepth;
    if (max_depth >= 0)
        g.LogAutoExpandMaxDepth = max_depth;
}